

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

ostream * vkt::sr::anon_unknown_0::operator<<(ostream *stream,TextureSwizzleComponent comp)

{
  long lVar1;
  char *pcVar2;
  
  switch(comp) {
  case TEXTURESWIZZLECOMPONENT_R:
    pcVar2 = "RED";
    break;
  case TEXTURESWIZZLECOMPONENT_G:
    pcVar2 = "GREEN";
    goto LAB_00661175;
  case TEXTURESWIZZLECOMPONENT_B:
    pcVar2 = "BLUE";
    goto LAB_0066115e;
  case TEXTURESWIZZLECOMPONENT_A:
    pcVar2 = "ALPHA";
LAB_00661175:
    lVar1 = 5;
    goto LAB_00661188;
  case TEXTURESWIZZLECOMPONENT_ZERO:
    pcVar2 = "ZERO";
LAB_0066115e:
    lVar1 = 4;
    goto LAB_00661188;
  case TEXTURESWIZZLECOMPONENT_ONE:
    pcVar2 = "ONE";
    break;
  default:
    goto switchD_00661143_default;
  }
  lVar1 = 3;
LAB_00661188:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
switchD_00661143_default:
  return stream;
}

Assistant:

static std::ostream& operator<< (std::ostream& stream, TextureSwizzleComponent comp)
{
	switch (comp)
	{
		case TEXTURESWIZZLECOMPONENT_R:		return stream << "RED";
		case TEXTURESWIZZLECOMPONENT_G:		return stream << "GREEN";
		case TEXTURESWIZZLECOMPONENT_B:		return stream << "BLUE";
		case TEXTURESWIZZLECOMPONENT_A:		return stream << "ALPHA";
		case TEXTURESWIZZLECOMPONENT_ZERO:	return stream << "ZERO";
		case TEXTURESWIZZLECOMPONENT_ONE:	return stream << "ONE";
		default: DE_ASSERT(false); return stream;
	}
}